

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::GatherBase::ComputeShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (**(code **)(*this + 0xa8))(&local_30);
  std::operator+(&local_50,
                 "#version 310 es                                       \nlayout(local_size_x = 1, local_size_y = 1) in;        \nlayout(std430) buffer Output {                        \n  mediump vec4 data;                                  \n} g_out;                                              \nuniform mediump vec4 cs_in;                           \n"
                 ,&local_30);
  std::operator+(__return_storage_ptr__,&local_50,
                 "void main() {                                         \n  g_out.data = test_function(cs_in);                  \n}                                                     \n"
                );
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string ComputeShader()
	{
		return "#version 310 es                                       \n"
			   "layout(local_size_x = 1, local_size_y = 1) in;        \n"
			   "layout(std430) buffer Output {                        \n"
			   "  mediump vec4 data;                                  \n"
			   "} g_out;                                              \n"
			   "uniform mediump vec4 cs_in;                           \n" +
			   TestFunction() + "void main() {                                         \n"
								"  g_out.data = test_function(cs_in);                  \n"
								"}                                                     \n";
	}